

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O0

void __thiscall
cmExternalMakefileProjectGeneratorFactory::~cmExternalMakefileProjectGeneratorFactory
          (cmExternalMakefileProjectGeneratorFactory *this)

{
  code *pcVar1;
  cmExternalMakefileProjectGeneratorFactory *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

cmExternalMakefileProjectGeneratorFactory::
  ~cmExternalMakefileProjectGeneratorFactory() = default;